

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureCompletenessTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::IncompleteCubeWrapModeCase::IncompleteCubeWrapModeCase
          (IncompleteCubeWrapModeCase *this,TestContext *testCtx,RenderContext *renderCtx,char *name
          ,char *description,IVec2 *size,deUint32 wrapT,deUint32 wrapS,ContextInfo *ctxInfo)

{
  int i;
  long lVar1;
  
  tcu::TestCase::TestCase((TestCase *)this,testCtx,name,description);
  (this->super_TexCubeCompletenessCase).m_testCtx = testCtx;
  (this->super_TexCubeCompletenessCase).m_renderCtx = renderCtx;
  (this->super_TexCubeCompletenessCase).m_compareColor.m_value = 0xff000000;
  (this->super_TexCubeCompletenessCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_02166cb0;
  *(deUint32 *)&(this->super_TexCubeCompletenessCase).field_0x84 = wrapT;
  this->m_wrapS = wrapS;
  this->m_ctxInfo = ctxInfo;
  lVar1 = 0;
  do {
    (this->m_size).m_data[lVar1] = size->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  return;
}

Assistant:

IncompleteCubeWrapModeCase::IncompleteCubeWrapModeCase (tcu::TestContext& testCtx, glu::RenderContext& renderCtx, const char* name, const char* description, IVec2 size, deUint32 wrapT, deUint32 wrapS, const glu::ContextInfo& ctxInfo)
	: TexCubeCompletenessCase	(testCtx, renderCtx, name, description)
	, m_wrapT					(wrapT)
	, m_wrapS					(wrapS)
	, m_ctxInfo					(ctxInfo)
	, m_size					(size)
{
}